

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

string * __thiscall
cmScriptGenerator::CreateConfigTest
          (string *__return_storage_ptr__,cmScriptGenerator *this,string *config)

{
  ulong uVar1;
  string *config_local;
  cmScriptGenerator *this_local;
  string *result;
  
  cmStrCat<std::__cxx11::string&,char_const(&)[13]>
            (__return_storage_ptr__,&this->RuntimeConfigVariable,(char (*) [13])" MATCHES \"^(");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmScriptGeneratorEncodeConfig(config,__return_storage_ptr__);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")$\"");
  return __return_storage_ptr__;
}

Assistant:

std::string cmScriptGenerator::CreateConfigTest(const std::string& config)
{
  std::string result = cmStrCat(this->RuntimeConfigVariable, " MATCHES \"^(");
  if (!config.empty()) {
    cmScriptGeneratorEncodeConfig(config, result);
  }
  result += ")$\"";
  return result;
}